

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::GetStaticLibraryFlags
          (cmLocalGenerator *this,string *flags,string *config,string *linkLanguage,
          cmGeneratorTarget *target)

{
  pointer *__return_storage_ptr__;
  cmMakefile *this_00;
  cmGeneratorTarget *this_01;
  string *psVar1;
  ulong uVar2;
  string *psVar3;
  char *pcVar4;
  undefined1 local_e8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  options;
  string name_1;
  string local_a8;
  undefined1 local_88 [8];
  string name;
  allocator<char> local_51;
  string local_50;
  cmGeneratorTarget *local_30;
  cmGeneratorTarget *target_local;
  string *linkLanguage_local;
  string *config_local;
  string *flags_local;
  cmLocalGenerator *this_local;
  
  this_00 = this->Makefile;
  local_30 = target;
  target_local = (cmGeneratorTarget *)linkLanguage;
  linkLanguage_local = config;
  config_local = flags;
  flags_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"CMAKE_STATIC_LINKER_FLAGS",&local_51);
  psVar1 = cmMakefile::GetSafeDefinition(this_00,&local_50);
  (*this->_vptr_cmLocalGenerator[6])(this,flags,psVar1);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                   "CMAKE_STATIC_LINKER_FLAGS_",linkLanguage_local);
    psVar1 = config_local;
    psVar3 = cmMakefile::GetSafeDefinition
                       (this->Makefile,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_88);
    (*this->_vptr_cmLocalGenerator[6])(this,psVar1,psVar3);
    std::__cxx11::string::~string((string *)local_88);
  }
  psVar1 = config_local;
  this_01 = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"STATIC_LIBRARY_FLAGS",
             (allocator<char> *)(name_1.field_2._M_local_buf + 0xf));
  pcVar4 = cmGeneratorTarget::GetProperty(this_01,&local_a8);
  (*this->_vptr_cmLocalGenerator[7])(this,psVar1,pcVar4);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)(name_1.field_2._M_local_buf + 0xf));
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    __return_storage_ptr__ =
         &options.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,"STATIC_LIBRARY_FLAGS_",linkLanguage_local);
    psVar1 = config_local;
    pcVar4 = cmGeneratorTarget::GetProperty(local_30,(string *)__return_storage_ptr__);
    (*this->_vptr_cmLocalGenerator[7])(this,psVar1,pcVar4);
    std::__cxx11::string::~string
              ((string *)
               &options.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_e8);
  cmGeneratorTarget::GetStaticLibraryLinkOptions
            (local_30,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_e8,linkLanguage_local,(string *)target_local);
  AppendCompileOptions
            (this,config_local,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_e8,(char *)0x0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_e8);
  return;
}

Assistant:

void cmLocalGenerator::GetStaticLibraryFlags(std::string& flags,
                                             std::string const& config,
                                             std::string const& linkLanguage,
                                             cmGeneratorTarget* target)
{
  this->AppendFlags(
    flags, this->Makefile->GetSafeDefinition("CMAKE_STATIC_LINKER_FLAGS"));
  if (!config.empty()) {
    std::string name = "CMAKE_STATIC_LINKER_FLAGS_" + config;
    this->AppendFlags(flags, this->Makefile->GetSafeDefinition(name));
  }
  this->AppendFlags(flags, target->GetProperty("STATIC_LIBRARY_FLAGS"));
  if (!config.empty()) {
    std::string name = "STATIC_LIBRARY_FLAGS_" + config;
    this->AppendFlags(flags, target->GetProperty(name));
  }

  std::vector<std::string> options;
  target->GetStaticLibraryLinkOptions(options, config, linkLanguage);
  // STATIC_LIBRARY_OPTIONS are escaped.
  this->AppendCompileOptions(flags, options);
}